

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

void mime_subparts_free(void *ptr)

{
  curl_mime *mime;
  void *ptr_local;
  
  if ((ptr != (void *)0x0) && (*(long *)((long)ptr + 8) != 0)) {
    *(undefined8 *)(*(long *)((long)ptr + 8) + 0x38) = 0;
    cleanup_part_content(*(curl_mimepart **)((long)ptr + 8));
  }
  curl_mime_free((curl_mime *)ptr);
  return;
}

Assistant:

static void mime_subparts_free(void *ptr)
{
  curl_mime *mime = (curl_mime *) ptr;

  if(mime && mime->parent) {
    mime->parent->freefunc = NULL;  /* Be sure we won't be called again. */
    cleanup_part_content(mime->parent);  /* Avoid dangling pointer in part. */
  }
  curl_mime_free(mime);
}